

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

boolean chest_trap(obj *obj,int bodypart,boolean disarm)

{
  char x;
  obj *poVar1;
  obj *obj_00;
  level *lev;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  monst *shkp;
  int tmp;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  coord cc;
  char buf [80];
  xchar local_92;
  xchar local_91;
  int local_90;
  int local_8c;
  char local_88 [88];
  
  bVar2 = get_obj_location(obj,&local_92,&local_91,0);
  if (bVar2 != '\0') {
    obj->ox = local_92;
    obj->oy = local_91;
  }
  obj->field_0x4b = obj->field_0x4b & 0x7f;
  pcVar8 = "You set it off!";
  if (disarm == '\0') {
    pcVar8 = "You trigger a trap!";
  }
  pline(pcVar8);
  (*windowprocs.win_pause)(P_MESSAGE);
  lVar7 = (long)u.uluck;
  lVar11 = (long)u.moreluck;
  if ((-0xd < (int)(lVar11 + lVar7)) &&
     (uVar4 = mt_random(), 7 < SUB164(ZEXT416(uVar4) % SEXT816(lVar11 + lVar7 + 0xd),0))) {
    uVar4 = mt_random();
    pline("But luckily the %s!",
          &DAT_002d3fec +
          *(int *)(&DAT_002d3fec + (ulong)(uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc)) * 4));
    return '\0';
  }
  uVar4 = mt_random();
  if ((uVar4 * -0x33333333 >> 2 | uVar4 * 0x40000000) < 0xccccccd) {
    uVar4 = mt_random();
    iVar5 = uVar4 - ((uVar4 / 0x1a) * 0x19 + uVar4 / 0x1a);
  }
  else {
    lVar7 = (long)u.uluck;
    lVar11 = (long)u.moreluck;
    iVar5 = 0;
    if ((int)(lVar11 + lVar7) < 0xd) {
      uVar4 = mt_random();
      iVar5 = SUB164(ZEXT416(uVar4) % SEXT816(0xd - (lVar11 + lVar7)),0);
    }
  }
  switch(iVar5) {
  case 0:
  case 1:
  case 2:
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar8 = rndcolor();
    }
    else {
      uVar4 = mt_random();
      pcVar8 = blindgas_rel + *(int *)(blindgas_rel + (ulong)(uVar4 % 6) * 4);
    }
    pcVar9 = xname(obj);
    pcVar9 = the(pcVar9);
    pline("A cloud of %s gas billows from %s.",pcVar8,pcVar9);
    if ((u.umonnum != 0x9e && u.uprops[0x1b].intrinsic == 0) && ((youmonst.data)->mlet != '\x1c')) {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          stagger(youmonst.data,"stagger");
          pcVar8 = "You %s and your vision blurs...";
        }
        else {
          stagger(youmonst.data,"stagger");
          pcVar8 = "You %s and get dizzy...";
        }
        pline(pcVar8);
      }
      else {
        pline("What a groovy feeling!");
      }
    }
    uVar4 = u.uprops[0x1b].intrinsic;
    uVar6 = mt_random();
    make_stunned((ulong)(uVar4 + uVar6 % 7 + 0x10),'\0');
    uVar4 = u.uprops[0x23].intrinsic;
    uVar6 = mt_random();
    make_hallucinated((ulong)(uVar4 + uVar6 % 5 + 0x10),'\0',0);
    break;
  case 3:
  case 4:
  case 5:
    if (u.uprops[0x38].extrinsic == 0) {
      pline("Suddenly you are frozen in place!");
      iVar5 = 5;
      iVar10 = -5;
      do {
        uVar4 = mt_random();
        iVar5 = iVar5 + uVar4 % 6;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0);
      nomul(-iVar5,"frozen by a trap");
      exercise(3,'\0');
      nomovemsg = "You can move again.";
    }
    else {
      pline("You momentarily stiffen.");
    }
    break;
  case 6:
  case 7:
  case 8:
    pline("You are jolted by a surge of electricity!");
    if (((u.uprops[5].intrinsic == 0 && u.uprops[5].extrinsic == 0) &&
        (((byte)youmonst.mintrinsics & 0x10) == 0)) ||
       (((u.uprops[5].intrinsic >> 0x1a & 1) != 0 &&
        (((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0 &&
         (((byte)youmonst.mintrinsics & 0x10) == 0)))))) {
      if (((u.uprops[5].intrinsic >> 0x1a & 1) == 0) ||
         (((u.uprops[5].intrinsic & 0xfbffffff) != 0 || u.uprops[5].extrinsic != 0 ||
          (((byte)youmonst.mintrinsics & 0x10) != 0)))) {
        iVar5 = 4;
        iVar10 = -4;
        do {
          uVar4 = mt_random();
          iVar5 = iVar5 + (uVar4 & 3);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
      }
      else {
        shieldeff(u.ux,u.uy);
        iVar5 = 2;
        iVar10 = -2;
        do {
          uVar4 = mt_random();
          iVar5 = iVar5 + (uVar4 & 3);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
      }
    }
    else {
      shieldeff(u.ux,u.uy);
      iVar5 = 0;
      pline("You don\'t seem to be affected.");
    }
    destroy_item(0xb,6);
    if (iVar5 != 0) {
      losehp(iVar5,"electric shock",0);
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    dofiretrap(obj);
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    pcVar8 = body_part(bodypart);
    pline("You feel a needle prick your %s.",pcVar8);
    pcVar9 = "needle";
    pcVar8 = "poisoned needle";
    iVar10 = 4;
    iVar5 = 10;
    goto LAB_0026c98b;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    pcVar8 = xname(obj);
    the(pcVar8);
    pline("A cloud of noxious gas billows from %s.");
    pcVar9 = "gas cloud";
    pcVar8 = "cloud of poison gas";
    iVar10 = 0;
    iVar5 = 0xf;
LAB_0026c98b:
    poisoned(pcVar9,iVar10,pcVar8,iVar5);
    exercise(4,'\0');
    break;
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
    x = obj->ox;
    cVar3 = obj->oy;
    bVar2 = costly_spot(x,cVar3);
    lev = level;
    local_90 = (int)cVar3;
    if (bVar2 == '\0') {
      shkp = (monst *)0x0;
      bVar12 = false;
    }
    else {
      pcVar8 = in_rooms(level,x,cVar3,0x12);
      shkp = shop_keeper(lev,*pcVar8);
      bVar12 = shkp != (monst *)0x0;
    }
    bVar13 = true;
    if ((u.ushops[0] != '\0') && (cVar3 = inside_shop(level,u.ux,u.uy), cVar3 != '\0')) {
      pcVar8 = in_rooms(level,x,(xchar)local_90,0x12);
      bVar13 = *pcVar8 != u.ushops[0];
    }
    pcVar8 = Tobjnam(obj,"explode");
    lVar7 = 0;
    pline("%s!",pcVar8);
    pcVar8 = xname(obj);
    sprintf(local_88,"exploding %s",pcVar8);
    if (bVar12) {
      lVar7 = stolen_value(obj,x,(xchar)local_90,(byte)(*(uint *)&shkp->field_0x60 >> 0x16) & 1,
                           '\x01');
    }
    delete_contents(obj);
    if (((uball != (obj *)0x0) && (uball->where != '\x03')) &&
       (((uchain->ox == u.ux && (uchain->oy == u.uy)) ||
        ((uball->ox == u.ux && (uball->oy == u.uy)))))) {
      unpunish();
    }
    obj_00 = level->objects[u.ux][u.uy];
    while (obj_00 != (obj *)0x0) {
      poVar1 = (obj_00->v).v_nexthere;
      if (bVar12) {
        lVar11 = stolen_value(obj_00,obj_00->ox,obj_00->oy,
                              (byte)(*(uint *)&shkp->field_0x60 >> 0x16) & 1,'\x01');
        lVar7 = lVar7 + lVar11;
      }
      delobj(obj_00);
      obj_00 = poVar1;
    }
    local_8c = (int)x;
    wake_nearby();
    iVar5 = 6;
    iVar10 = -6;
    do {
      uVar4 = mt_random();
      iVar5 = iVar5 + uVar4 % 6;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
    losehp(iVar5,local_88,0);
    exercise(0,'\0');
    if (!bVar12) {
      return '\x01';
    }
    if (lVar7 == 0) {
      return '\x01';
    }
    pcVar8 = currency(lVar7);
    if (bVar13) {
      pline("You caused %ld %s worth of damage!",lVar7,pcVar8);
      make_angry_shk(shkp,(xchar)local_8c,(xchar)local_90);
      return '\x01';
    }
    pline("You owe %ld %s for objects destroyed.",lVar7,pcVar8);
    return '\x01';
  default:
    warning("bad chest trap");
  }
  bot();
  return '\0';
}

Assistant:

boolean chest_trap(struct obj *obj, int bodypart, boolean disarm)
{
	struct obj *otmp = obj, *otmp2;
	char	buf[80];
	const char *msg;
	coord cc;

	if (get_obj_location(obj, &cc.x, &cc.y, 0))	/* might be carried */
	    obj->ox = cc.x,  obj->oy = cc.y;

	otmp->otrapped = 0;	/* trap is one-shot; clear flag first in case
				   chest kills you and ends up in bones file */
	pline(disarm ? "You set it off!" : "You trigger a trap!");
	win_pause_output(P_MESSAGE);
	if (Luck > -13 && rn2(13+Luck) > 7) {	/* saved by luck */
	    /* trap went off, but good luck prevents damage */
	    switch (rn2(13)) {
		case 12:
		case 11:  msg = "explosive charge is a dud";  break;
		case 10:
		case  9:  msg = "electric charge is grounded";  break;
		case  8:
		case  7:  msg = "flame fizzles out";  break;
		case  6:
		case  5:
		case  4:  msg = "poisoned needle misses";  break;
		case  3:
		case  2:
		case  1:
		case  0:  msg = "gas cloud blows away";  break;
		default:  warning("chest disarm bug");  msg = NULL;
			  break;
	    }
	    if (msg) pline("But luckily the %s!", msg);
	} else {
	    switch(rn2(20) ? ((Luck >= 13) ? 0 : rn2(13-Luck)) : rn2(26)) {
		case 25:
		case 24:
		case 23:
		case 22:
		case 21: {
			  struct monst *shkp = 0;
			  long loss = 0L;
			  boolean costly, insider;
			  xchar ox = obj->ox, oy = obj->oy;

			  /* the obj location need not be that of player */
			  costly = (costly_spot(ox, oy) &&
				   (shkp = shop_keeper(level, *in_rooms(level, ox, oy,
				    SHOPBASE))) != NULL);
			  insider = (*u.ushops && inside_shop(level, u.ux, u.uy) &&
				    *in_rooms(level, ox, oy, SHOPBASE) == *u.ushops);

			  pline("%s!", Tobjnam(obj, "explode"));
			  sprintf(buf, "exploding %s", xname(obj));

			  if (costly)
			      loss += stolen_value(obj, ox, oy,
						(boolean)shkp->mpeaceful, TRUE);
			  delete_contents(obj);
			  /* we're about to delete all things at this location,
			   * which could include the ball & chain.
			   * If we attempt to call unpunish() in the
			   * for-loop below we can end up with otmp2
			   * being invalid once the chain is gone.
			   * Deal with ball & chain right now instead.
			   */
			  if (Punished && !carried(uball) &&
				((uchain->ox == u.ux && uchain->oy == u.uy) ||
				 (uball->ox == u.ux && uball->oy == u.uy)))
				unpunish();

			  for (otmp = level->objects[u.ux][u.uy];
							otmp; otmp = otmp2) {
			      otmp2 = otmp->nexthere;
			      if (costly)
				  loss += stolen_value(otmp, otmp->ox,
					  otmp->oy, (boolean)shkp->mpeaceful,
					  TRUE);
			      delobj(otmp);
			  }
			  wake_nearby();
			  losehp(dice(6,6), buf, KILLED_BY_AN);
			  exercise(A_STR, FALSE);
			  if (costly && loss) {
			      if (insider)
			      pline("You owe %ld %s for objects destroyed.",
							loss, currency(loss));
			      else {
				  pline("You caused %ld %s worth of damage!",
							loss, currency(loss));
				  make_angry_shk(shkp, ox, oy);
			      }
			  }
			  return TRUE;
			}
		case 20:
		case 19:
		case 18:
		case 17:
			pline("A cloud of noxious gas billows from %s.",
							the(xname(obj)));
			poisoned("gas cloud", A_STR, "cloud of poison gas",15);
			exercise(A_CON, FALSE);
			break;
		case 16:
		case 15:
		case 14:
		case 13:
			pline("You feel a needle prick your %s.",body_part(bodypart));
			poisoned("needle", A_CON, "poisoned needle",10);
			exercise(A_CON, FALSE);
			break;
		case 12:
		case 11:
		case 10:
		case 9:
			dofiretrap(obj);
			break;
		case 8:
		case 7:
		case 6: {
			int dmg;

			pline("You are jolted by a surge of electricity!");
			if (FShock_resistance)  {
			    shieldeff(u.ux, u.uy);
			    pline("You don't seem to be affected.");
			    dmg = 0;
			} else if (PShock_resistance) {
			    shieldeff(u.ux, u.uy);
			    dmg = dice(2, 4);
			} else {
			    dmg = dice(4, 4);
			}
			destroy_item(WAND_CLASS, AD_ELEC);
			if (dmg) losehp(dmg, "electric shock", KILLED_BY_AN);
			break;
		      }
		case 5:
		case 4:
		case 3:
			if (!Free_action) {                        
			pline("Suddenly you are frozen in place!");
			nomul(-dice(5, 6), "frozen by a trap");
			exercise(A_DEX, FALSE);
			nomovemsg = "You can move again.";
			} else pline("You momentarily stiffen.");
			break;
		case 2:
		case 1:
		case 0:
			pline("A cloud of %s gas billows from %s.",
				Blind ? blindgas[rn2(SIZE(blindgas))] :
				rndcolor(), the(xname(obj)));
			if (!Stunned) {
			    if (Hallucination)
				pline("What a groovy feeling!");
			    else if (Blind)
				pline("You %s and get dizzy...",
				    stagger(youmonst.data, "stagger"));
			    else
				pline("You %s and your vision blurs...",
				    stagger(youmonst.data, "stagger"));
			}
			make_stunned(HStun + rn1(7, 16),FALSE);
			make_hallucinated(HHallucination + rn1(5, 16),FALSE,0L);
			break;
		default: warning("bad chest trap");
			break;
	    }
	    bot();			/* to get immediate botl re-display */
	}

	return FALSE;
}